

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O2

bool __thiscall
wallet::WalletBatch::WriteDescriptorKey
          (WalletBatch *this,uint256 *desc_id,CPubKey *pubkey,CPrivKey *privkey)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  uint256 local_170;
  pair<std::vector<unsigned_char,_secure_allocator<unsigned_char>_>,_uint256> local_150;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [72];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<uint256,_CPubKey>_>
  local_b0;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((pubkey->vch[0] & 0xfe) == 2) {
    lVar3 = 0x21;
  }
  else {
    bVar1 = pubkey->vch[0] - 4;
    if (bVar1 < 4) {
      lVar3 = *(long *)(&DAT_00b70b20 + (ulong)bVar1 * 8);
    }
    else {
      lVar3 = 0;
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (&key,(size_type)
                  ((privkey->super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish +
                  (lVar3 - (long)(privkey->
                                 super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>
                                 )._M_impl.super__Vector_impl_data._M_start)));
  if ((pubkey->vch[0] & 0xfe) == 2) {
    lVar3 = 0x21;
  }
  else {
    bVar1 = pubkey->vch[0] - 4;
    if (bVar1 < 4) {
      lVar3 = *(long *)(&DAT_00b70b20 + (ulong)bVar1 * 8);
    }
    else {
      lVar3 = 0;
    }
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&key,
             (const_iterator)
             key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,pubkey->vch,pubkey->vch + lVar3);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,secure_allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&key,
             (const_iterator)
             key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_>
              )(privkey->super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_>
              )(privkey->super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_finish);
  local_118 = *(undefined8 *)(desc_id->super_base_blob<256U>).m_data._M_elems;
  uStack_110 = *(undefined8 *)((desc_id->super_base_blob<256U>).m_data._M_elems + 8);
  local_108 = *(undefined8 *)((desc_id->super_base_blob<256U>).m_data._M_elems + 0x10);
  uStack_100 = *(undefined8 *)((desc_id->super_base_blob<256U>).m_data._M_elems + 0x18);
  memcpy(local_f8,pubkey,0x41);
  std::__cxx11::string::string
            ((string *)&local_b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             DBKeys::WALLETDESCRIPTORKEY_abi_cxx11_);
  memcpy(&local_b0.second,&local_118,0x61);
  Hash<std::vector<unsigned_char,std::allocator<unsigned_char>>>(&local_170,&key);
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::vector(&local_150.first,privkey);
  local_150.second.super_base_blob<256U>.m_data._M_elems[0x10] =
       local_170.super_base_blob<256U>.m_data._M_elems[0x10];
  local_150.second.super_base_blob<256U>.m_data._M_elems[0x11] =
       local_170.super_base_blob<256U>.m_data._M_elems[0x11];
  local_150.second.super_base_blob<256U>.m_data._M_elems[0x12] =
       local_170.super_base_blob<256U>.m_data._M_elems[0x12];
  local_150.second.super_base_blob<256U>.m_data._M_elems[0x13] =
       local_170.super_base_blob<256U>.m_data._M_elems[0x13];
  local_150.second.super_base_blob<256U>.m_data._M_elems[0x14] =
       local_170.super_base_blob<256U>.m_data._M_elems[0x14];
  local_150.second.super_base_blob<256U>.m_data._M_elems[0x15] =
       local_170.super_base_blob<256U>.m_data._M_elems[0x15];
  local_150.second.super_base_blob<256U>.m_data._M_elems[0x16] =
       local_170.super_base_blob<256U>.m_data._M_elems[0x16];
  local_150.second.super_base_blob<256U>.m_data._M_elems[0x17] =
       local_170.super_base_blob<256U>.m_data._M_elems[0x17];
  local_150.second.super_base_blob<256U>.m_data._M_elems[0x18] =
       local_170.super_base_blob<256U>.m_data._M_elems[0x18];
  local_150.second.super_base_blob<256U>.m_data._M_elems[0x19] =
       local_170.super_base_blob<256U>.m_data._M_elems[0x19];
  local_150.second.super_base_blob<256U>.m_data._M_elems[0x1a] =
       local_170.super_base_blob<256U>.m_data._M_elems[0x1a];
  local_150.second.super_base_blob<256U>.m_data._M_elems[0x1b] =
       local_170.super_base_blob<256U>.m_data._M_elems[0x1b];
  local_150.second.super_base_blob<256U>.m_data._M_elems[0x1c] =
       local_170.super_base_blob<256U>.m_data._M_elems[0x1c];
  local_150.second.super_base_blob<256U>.m_data._M_elems[0x1d] =
       local_170.super_base_blob<256U>.m_data._M_elems[0x1d];
  local_150.second.super_base_blob<256U>.m_data._M_elems[0x1e] =
       local_170.super_base_blob<256U>.m_data._M_elems[0x1e];
  local_150.second.super_base_blob<256U>.m_data._M_elems[0x1f] =
       local_170.super_base_blob<256U>.m_data._M_elems[0x1f];
  local_150.second.super_base_blob<256U>.m_data._M_elems[0] =
       local_170.super_base_blob<256U>.m_data._M_elems[0];
  local_150.second.super_base_blob<256U>.m_data._M_elems[1] =
       local_170.super_base_blob<256U>.m_data._M_elems[1];
  local_150.second.super_base_blob<256U>.m_data._M_elems[2] =
       local_170.super_base_blob<256U>.m_data._M_elems[2];
  local_150.second.super_base_blob<256U>.m_data._M_elems[3] =
       local_170.super_base_blob<256U>.m_data._M_elems[3];
  local_150.second.super_base_blob<256U>.m_data._M_elems[4] =
       local_170.super_base_blob<256U>.m_data._M_elems[4];
  local_150.second.super_base_blob<256U>.m_data._M_elems[5] =
       local_170.super_base_blob<256U>.m_data._M_elems[5];
  local_150.second.super_base_blob<256U>.m_data._M_elems[6] =
       local_170.super_base_blob<256U>.m_data._M_elems[6];
  local_150.second.super_base_blob<256U>.m_data._M_elems[7] =
       local_170.super_base_blob<256U>.m_data._M_elems[7];
  local_150.second.super_base_blob<256U>.m_data._M_elems[8] =
       local_170.super_base_blob<256U>.m_data._M_elems[8];
  local_150.second.super_base_blob<256U>.m_data._M_elems[9] =
       local_170.super_base_blob<256U>.m_data._M_elems[9];
  local_150.second.super_base_blob<256U>.m_data._M_elems[10] =
       local_170.super_base_blob<256U>.m_data._M_elems[10];
  local_150.second.super_base_blob<256U>.m_data._M_elems[0xb] =
       local_170.super_base_blob<256U>.m_data._M_elems[0xb];
  local_150.second.super_base_blob<256U>.m_data._M_elems[0xc] =
       local_170.super_base_blob<256U>.m_data._M_elems[0xc];
  local_150.second.super_base_blob<256U>.m_data._M_elems[0xd] =
       local_170.super_base_blob<256U>.m_data._M_elems[0xd];
  local_150.second.super_base_blob<256U>.m_data._M_elems[0xe] =
       local_170.super_base_blob<256U>.m_data._M_elems[0xe];
  local_150.second.super_base_blob<256U>.m_data._M_elems[0xf] =
       local_170.super_base_blob<256U>.m_data._M_elems[0xf];
  bVar2 = WriteIC<std::pair<std::__cxx11::string,std::pair<uint256,CPubKey>>,std::pair<std::vector<unsigned_char,secure_allocator<unsigned_char>>,uint256>>
                    (this,&local_b0,&local_150,false);
  std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_> *)&local_150);
  std::__cxx11::string::~string((string *)&local_b0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteDescriptorKey(const uint256& desc_id, const CPubKey& pubkey, const CPrivKey& privkey)
{
    // hash pubkey/privkey to accelerate wallet load
    std::vector<unsigned char> key;
    key.reserve(pubkey.size() + privkey.size());
    key.insert(key.end(), pubkey.begin(), pubkey.end());
    key.insert(key.end(), privkey.begin(), privkey.end());

    return WriteIC(std::make_pair(DBKeys::WALLETDESCRIPTORKEY, std::make_pair(desc_id, pubkey)), std::make_pair(privkey, Hash(key)), false);
}